

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml.c
# Opt level: O0

void av1_nn_output_prec_reduce(float *output,int num_output)

{
  int i;
  float inv_prec;
  int prec;
  int prec_bits;
  int num_output_local;
  float *output_local;
  
  for (i = 0; i < num_output; i = i + 1) {
    output[i] = (float)(int)(output[i] * 512.0 + 0.5) * 0.001953125;
  }
  return;
}

Assistant:

void av1_nn_output_prec_reduce(float *const output, int num_output) {
  const int prec_bits = 9;
  const int prec = 1 << prec_bits;
  const float inv_prec = (float)(1.0 / prec);
  for (int i = 0; i < num_output; i++) {
    output[i] = ((int)(output[i] * prec + 0.5)) * inv_prec;
  }
}